

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_error.hpp
# Opt level: O3

bool boost::xpressive::detail::ensure_
               (bool cond,error_type code,char *msg,char *fun,char *file,unsigned_long line)

{
  undefined7 in_register_00000039;
  undefined **local_68 [2];
  undefined **local_58;
  refcount_ptr<boost::exception_detail::error_info_container> local_50;
  char *local_48;
  char *local_40;
  int local_38;
  int local_34;
  error_type local_30;
  
  if ((int)CONCAT71(in_register_00000039,cond) != 0) {
    return true;
  }
  std::runtime_error::runtime_error((runtime_error *)local_68,msg);
  local_50.px_ = (error_info_container *)0x0;
  local_34 = -1;
  local_68[0] = &PTR__regex_error_00193398;
  local_58 = &PTR__regex_error_001933c0;
  local_38 = (int)line;
  local_48 = fun;
  local_40 = file;
  local_30 = code;
  throw_exception<boost::xpressive::regex_error>((regex_error *)local_68);
}

Assistant:

inline bool ensure_(
        bool cond
      , regex_constants::error_type code
      , char const *msg
      , char const *fun
      , char const *file
      , unsigned long line
    )
    {
        if(!cond)
        {
            #ifndef BOOST_EXCEPTION_DISABLE
            boost::throw_exception(
                boost::xpressive::regex_error(code, msg)
                    << boost::throw_function(fun)
                    << boost::throw_file(file)
                    << boost::throw_line((int)line)
            );
            #else
            boost::throw_exception(boost::xpressive::regex_error(code, msg));
            #endif
        }
        return true;
    }